

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O2

ValueNode * __thiscall
mp::pre::CreateArray<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>
          (ValueNode *__return_storage_ptr__,pre *this,BasicValuePresolver *vp)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  ValueNode::ValueNode(__return_storage_ptr__,(BasicValuePresolver *)this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline
ValueNode CreateArray(BasicValuePresolver& vp) { return ValueNode{vp}; }